

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O3

bool __thiscall axl::cry::X509Cert::loadDer(X509Cert *this,void *p0,size_t size)

{
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> HVar1;
  bool bVar2;
  X509 *pXVar3;
  X509 *cert;
  uchar_t *p;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> local_30;
  uchar *local_28;
  
  pXVar3 = (X509 *)(this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>).
                   m_h;
  if (pXVar3 != (X509 *)0x0) {
    X509_free(pXVar3);
    (this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>).m_h =
         (x509_st *)0x0;
  }
  local_28 = (uchar *)p0;
  local_30.m_h = (x509_st *)X509_new();
  pXVar3 = d2i_X509((X509 **)&local_30,&local_28,size);
  HVar1.m_h = local_30.m_h;
  if (pXVar3 == (X509 *)0x0) {
    bVar2 = failWithLastCryptoError<bool>(false);
  }
  else {
    pXVar3 = (X509 *)(this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>).
                     m_h;
    if (pXVar3 != (X509 *)0x0) {
      X509_free(pXVar3);
    }
    (this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>).m_h = HVar1.m_h;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
X509Cert::loadDer(
	const void* p0,
	size_t size
) {
	close();

	const uchar_t* p = (uchar_t*)p0;
	X509* cert = X509_new();
	X509* result = d2i_X509(&cert, &p, size);
	if (!result) {
		ASSERT(cert == NULL); // should have been freed already
		return failWithLastCryptoError();
	}

	attach(cert);
	return true;
}